

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O0

frame * string_from_frame_abi_cxx11_(frame *f)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  frame *f_local;
  
  f_local = f;
  std::operator+(local_58,in_RSI);
  std::operator+(local_38,local_58);
  std::operator+(&f->addr,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  return f;
}

Assistant:

string string_from_frame(frame &f) {
	return f.addr + f.func + f.data + f.crc;
}